

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

int PHF::init<std::__cxx11::string,false>
              (phf *phf,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
              size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k_03;
  string *psVar7;
  void *pvVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  string *psVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  size_t __nmemb;
  string *psVar21;
  ulong uVar22;
  string *psVar23;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  ulong local_98;
  uint32_t *local_90;
  size_t local_88;
  void *local_80;
  string *local_78;
  size_t local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  void *local_48;
  string *local_40;
  phf_seed_t local_34;
  
  __nmemb = n + (n == 0);
  uVar15 = l + (l == 0);
  sVar20 = 100;
  if (a < 100) {
    sVar20 = a;
  }
  phf->nodiv = false;
  local_34 = seed;
  sVar11 = phf_primeup(((__nmemb + uVar15) - 1) / uVar15);
  local_70 = phf_primeup((__nmemb * 100) / (sVar20 + (sVar20 == 0)));
  if (local_70 == 0 || sVar11 == 0) {
    return 0x22;
  }
  local_88 = sVar11;
  local_78 = (string *)calloc(__nmemb,0x30);
  if ((local_78 == (string *)0x0) || (local_80 = calloc(local_88,8), local_80 == (void *)0x0)) {
    local_48 = (void *)0x0;
    local_80 = (void *)0x0;
  }
  else {
    local_48 = (void *)__nmemb;
    local_40 = (string *)n;
    if (n != 0) {
      psVar21 = local_78;
      do {
        local_118 = local_108;
        pcVar3 = (k->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar3,pcVar3 + k->_M_string_length);
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,local_118,local_118 + local_110);
        k_00._M_string_length = in_stack_fffffffffffffed0;
        k_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
        k_00.field_2._M_allocated_capacity = (size_type)phf;
        k_00.field_2._8_8_ = in_stack_fffffffffffffee0;
        uVar9 = phf_g<std::__cxx11::string>(k_00,(uint32_t)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_88;
        lVar16 = SUB168(ZEXT416(uVar9) % auVar4,0);
        if (local_118 != local_108) {
          operator_delete(local_118);
        }
        std::__cxx11::string::_M_assign(psVar21);
        *(int *)(psVar21 + 0x20) = SUB164(ZEXT416(uVar9) % auVar4,0);
        plVar1 = (long *)((long)local_80 + lVar16 * 8);
        *plVar1 = *plVar1 + 1;
        *(void **)(psVar21 + 0x28) = (void *)((long)local_80 + lVar16 * 8);
        psVar21 = psVar21 + 0x30;
        k = k + 1;
        n = n - 1;
      } while (n != 0);
    }
    qsort(local_78,(size_t)local_48,0x30,phf_keycmp<std::__cxx11::string>);
    uVar15 = local_70 + 0x3f >> 6;
    local_48 = calloc(uVar15 * 2,8);
    if (local_48 == (void *)0x0) {
      local_48 = (void *)0x0;
    }
    else {
      local_90 = (uint32_t *)calloc(local_88,4);
      pvVar8 = local_48;
      if (local_90 != (uint32_t *)0x0) {
        local_98 = 0;
        if ((long)local_40 < 1) {
          uVar13 = 0;
        }
        else {
          psVar17 = local_78 + (long)local_40 * 0x30;
          uVar13 = 0;
          psVar21 = local_78;
          do {
            lVar16 = **(long **)(psVar21 + 0x28);
            if (lVar16 == 0) break;
            psVar23 = psVar21 + lVar16 * 0x30;
            uVar22 = 1;
            while (uVar9 = (uint32_t)uVar22, local_40 = psVar21, psVar7 = psVar21, 0 < lVar16) {
              while( true ) {
                local_f8 = local_e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f8,*(long *)psVar21,
                           *(long *)(psVar21 + 8) + *(long *)psVar21);
                local_68[0] = local_58;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_68,local_f8,local_f8 + local_f0);
                k_01._M_string_length = uVar13;
                k_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
                k_01.field_2._M_allocated_capacity = (size_type)phf;
                k_01.field_2._8_8_ = psVar17;
                uVar10 = phf_f<std::__cxx11::string>(uVar9,k_01,(uint32_t)local_68[0]);
                if (local_68[0] != local_58) {
                  operator_delete(local_68[0]);
                }
                uVar18 = (ulong)uVar10 % local_70;
                if (local_f8 != local_e8) {
                  operator_delete(local_f8);
                }
                uVar12 = uVar18 >> 6;
                uVar19 = 1L << ((byte)uVar18 & 0x3f);
                psVar7 = local_40;
                if (((*(ulong *)((long)local_48 + uVar12 * 8) >> (uVar18 & 0x3f) & 1) != 0) ||
                   (uVar18 = *(ulong *)((long)pvVar8 + uVar12 * 8 + uVar15 * 8),
                   (uVar18 & uVar19) != 0)) break;
                *(ulong *)((long)pvVar8 + uVar12 * 8 + uVar15 * 8) = uVar18 | uVar19;
                psVar21 = psVar21 + 0x30;
                if (psVar23 <= psVar21) goto joined_r0x00122f0d;
              }
              for (; psVar7 < psVar23; psVar7 = psVar7 + 0x30) {
                local_d8 = local_c8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,*(long *)psVar7,
                           *(long *)(psVar7 + 8) + *(long *)psVar7);
                local_68[0] = local_58;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_68,local_d8,local_d8 + local_d0);
                k_02._M_string_length = uVar13;
                k_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
                k_02.field_2._M_allocated_capacity = (size_type)phf;
                k_02.field_2._8_8_ = psVar17;
                uVar10 = phf_f<std::__cxx11::string>(uVar9,k_02,(uint32_t)local_68[0]);
                if (local_68[0] != local_58) {
                  operator_delete(local_68[0]);
                }
                uVar18 = (ulong)uVar10 % local_70;
                if (local_d8 != local_c8) {
                  operator_delete(local_d8);
                }
                bVar6 = (byte)uVar18 & 0x3f;
                puVar2 = (ulong *)((long)pvVar8 + (uVar18 >> 6) * 8 + uVar15 * 8);
                *puVar2 = *puVar2 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              }
              uVar22 = uVar22 + 1;
              lVar16 = **(long **)(local_40 + 0x28);
              psVar23 = local_40 + lVar16 * 0x30;
              psVar21 = local_40;
            }
joined_r0x00122f0d:
            for (; psVar7 < psVar23; psVar7 = psVar7 + 0x30) {
              local_b8 = local_a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,*(long *)psVar7,*(long *)(psVar7 + 8) + *(long *)psVar7
                        );
              local_68[0] = local_58;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_68,local_b8,local_b8 + local_b0);
              k_03._M_string_length = uVar13;
              k_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
              k_03.field_2._M_allocated_capacity = (size_type)phf;
              k_03.field_2._8_8_ = psVar17;
              uVar10 = phf_f<std::__cxx11::string>(uVar9,k_03,(uint32_t)local_68[0]);
              if (local_68[0] != local_58) {
                operator_delete(local_68[0]);
              }
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_70;
              if (local_b8 != local_a8) {
                operator_delete(local_b8);
              }
              puVar2 = (ulong *)((long)local_48 + (SUB168(ZEXT416(uVar10) % auVar5,0) >> 6) * 8);
              *puVar2 = *puVar2 | 1L << (SUB161(ZEXT416(uVar10) % auVar5,0) & 0x3f);
            }
            uVar13 = uVar13 & 0xffffffff;
            if (uVar13 < uVar22) {
              uVar13 = uVar22;
            }
            local_90[*(uint *)(local_40 + 0x20)] = uVar9;
            psVar21 = local_40 + **(long **)(local_40 + 0x28) * 0x30;
          } while (psVar21 < psVar17);
          uVar13 = uVar13 & 0xffffffff;
        }
        phf->seed = local_34;
        phf->r = local_88;
        phf->m = local_70;
        phf->g = local_90;
        phf->d_max = uVar13;
        phf->g_op = PHF_G_UINT32_MOD_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_00123030;
      }
    }
  }
  puVar14 = (uint *)__errno_location();
  local_98 = (ulong)*puVar14;
LAB_00123030:
  free(local_48);
  free(local_80);
  free(local_78);
  return (int)local_98;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}